

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

wchar_t canLrzip(void)

{
  wchar_t wVar1;
  
  if (canLrzip_tested == '\0') {
    canLrzip_tested = '\x01';
    wVar1 = systemf("lrzip -V %s",">/dev/null 2>/dev/null");
    if (wVar1 == L'\0') {
      canLrzip_value = 1;
    }
  }
  return (uint)canLrzip_value;
}

Assistant:

int
canLrzip(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("lrzip -V %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}